

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d603ce::SegmentTree::produceIntersections(SegmentTree *this,int segment)

{
  long lVar1;
  RectF *segmentBounds_00;
  int in_ESI;
  QPathSegments *in_RDI;
  long in_FS_OFFSET;
  QRectF *segmentBounds;
  RectF sbounds;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  QPathSegments *node;
  SegmentTree *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node = in_RDI;
  segmentBounds_00 = (RectF *)QPathSegments::elementBounds(in_RDI,in_stack_ffffffffffffffac);
  this_00 = (SegmentTree *)QRectF::left((QRectF *)segmentBounds_00);
  QRectF::top((QRectF *)segmentBounds_00);
  QRectF::right((QRectF *)segmentBounds_00);
  QRectF::bottom((QRectF *)segmentBounds_00);
  uVar2 = 0;
  QList<(anonymous_namespace)::TreeNode>::at
            ((QList<(anonymous_namespace)::TreeNode> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  produceIntersections
            (this_00,(TreeNode *)node,in_ESI,segmentBounds_00,
             (RectF *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),(int)((ulong)in_RDI >> 0x20));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SegmentTree::produceIntersections(int segment)
{
    const QRectF &segmentBounds = m_segments.elementBounds(segment);

    RectF sbounds;
    sbounds.x1 = segmentBounds.left();
    sbounds.y1 = segmentBounds.top();
    sbounds.x2 = segmentBounds.right();
    sbounds.y2 = segmentBounds.bottom();

    produceIntersections(m_tree.at(0), segment, sbounds, m_bounds, 0);
}